

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend-reg.cpp
# Opt level: O1

ggml_backend_dev_t ggml_backend_dev_by_name(char *name)

{
  bool bVar1;
  ggml_backend_dev_t pgVar2;
  char *a;
  size_t index;
  
  get_reg();
  if (get_reg::reg.devices.
      super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      get_reg::reg.devices.
      super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    index = 0;
    do {
      pgVar2 = ggml_backend_dev_get(index);
      a = (char *)ggml_backend_dev_name(pgVar2);
      bVar1 = striequals(a,name);
      if (bVar1) {
        return pgVar2;
      }
      index = index + 1;
      get_reg();
    } while (index < (ulong)((long)get_reg::reg.devices.
                                   super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)get_reg::reg.devices.
                                   super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return (ggml_backend_dev_t)0x0;
}

Assistant:

ggml_backend_dev_t ggml_backend_dev_by_name(const char * name) {
    for (size_t i = 0; i < ggml_backend_dev_count(); i++) {
        ggml_backend_dev_t dev = ggml_backend_dev_get(i);
        if (striequals(ggml_backend_dev_name(dev), name)) {
            return dev;
        }
    }
    return nullptr;
}